

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

void __thiscall SGParser::Generator::Lex::CreateRegExpGrammar(Lex *this,Grammar *grammar)

{
  char *__s;
  Grammar *this_00;
  long lVar1;
  mapped_type *pmVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  undefined1 local_4a8 [8];
  Production p;
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  undefined4 local_3c0;
  undefined1 *local_3b8 [2];
  undefined1 local_3a8 [16];
  undefined4 local_398;
  undefined1 *local_390 [2];
  undefined1 local_380 [16];
  undefined4 local_370;
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined4 local_348;
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  undefined4 local_320;
  undefined1 *local_318 [2];
  undefined1 local_308 [16];
  undefined4 local_2f8;
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined4 local_2d0;
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined4 local_2a8;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined4 local_280;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined4 local_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined4 local_230;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined4 local_1e0;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined4 local_1b8;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined4 local_190;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined4 local_168;
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined4 local_140;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined4 local_118;
  long *local_110 [2];
  long local_100 [2];
  undefined4 local_f0;
  undefined1 local_e8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  grammarSymbols;
  uint arr [4];
  vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  productions;
  key_type local_88;
  Grammar *local_68;
  String local_60;
  long local_40;
  allocator<char> local_32;
  allocator<char> local_31;
  
  local_4a8 = (undefined1  [8])&p.Name._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"RegExp\'","");
  p.Name.field_2._8_4_ = 1;
  p._32_8_ = &p.pRight;
  std::__cxx11::string::_M_construct<char_const*>((string *)&p.Id,"RegExp","");
  p.NotReported = true;
  p._65_3_ = 0;
  p.ReduceOverrides._M_t._M_impl._0_8_ =
       &p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&p.ReduceOverrides,"A","");
  p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 3;
  p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count,"B","");
  p.ConflictActions._M_t._M_impl._0_4_ = 4;
  p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       &p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header,"C","");
  p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 5;
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"D","");
  local_3c0 = 6;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"E","");
  local_398 = 7;
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"CharSet","");
  local_370 = 8;
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"GroupSet","");
  local_348 = 9;
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"character","");
  local_320 = 0x80000065;
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"+","");
  local_2f8 = 0x8000002d;
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"?","");
  local_2d0 = 0x80000041;
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,".","");
  local_2a8 = 0x80000030;
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"|","");
  local_280 = 0x8000007e;
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"*","");
  local_258 = 0x8000002c;
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"(","");
  local_230 = 0x8000002a;
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,")","");
  local_208 = 0x8000002b;
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"[","");
  local_1e0 = 0x8000005d;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"]","");
  local_1b8 = 0x8000005f;
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"{","");
  local_190 = 0x8000007d;
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"}","");
  local_168 = 0x8000007f;
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"-","");
  local_140 = 0x8000002f;
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"^","");
  local_118 = 0x80000060;
  plVar4 = local_100;
  local_110[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"$","");
  local_f0 = 0x80000026;
  __l._M_len = 0x18;
  __l._M_array = (iterator)local_4a8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_e8,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_60,(allocator_type *)&local_88);
  lVar3 = -0x3c0;
  local_68 = grammar;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  arr[2] = 0;
  arr[3] = 0;
  lVar3 = 0x1647d8;
  local_40 = 0;
  do {
    lVar5 = 0;
    do {
      __s = *(char **)(lVar3 + lVar5 * 8);
      if (__s != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_4a8,__s,(allocator<char> *)&local_60);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)local_e8,(key_type *)local_4a8);
        arr[lVar5 + -2] = *pmVar2;
        if (local_4a8 != (undefined1  [8])&p.Name._M_string_length) {
          operator_delete((void *)local_4a8,p.Name._M_string_length + 1);
        }
      }
      lVar1 = local_40;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,CreateRegExpGrammar::init[local_40].pName,&local_32);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,CreateRegExpGrammar::init[lVar1].pSymbol,&local_31);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)local_e8,&local_88);
    Production::Production
              ((Production *)local_4a8,&local_60,*pmVar2,
               (uint *)&grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count,
               CreateRegExpGrammar::init[lVar1].Length,0,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>::
    push_back((vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
               *)(arr + 2),(Production *)local_4a8);
    Production::~Production((Production *)local_4a8);
    this_00 = local_68;
    local_40 = local_40 + 1;
    lVar3 = lVar3 + 0x38;
  } while (local_40 != 0x14);
  Grammar::Clear(local_68);
  Grammar::AddGrammarSymbols
            (this_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)local_e8);
  Grammar::AddProductions
            (this_00,(vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                      *)(arr + 2));
  std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>::
  ~vector((vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
           *)(arr + 2));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)local_e8);
  return;
}

Assistant:

void Lex::CreateRegExpGrammar(Grammar& grammar) const {
    // Define a grammar. Notice the first production is the "augment"
    // production. You've always got to have it since it tells the
    // parser the start symbol and creates an augmented grammar

    // RegExp'      -> RegExp
    // RegExp       -> RegExp A (concatenation operator is implicit)
    // RegExp       -> A

    // A            -> A '|' B
    // A            -> B

    // B            -> B '*'
    // B            -> B '+'
    // B            -> B '?'
    // B            -> C

    // C            -> '(' RegExp ')'
    // C            -> character
    // C            -> '.'
    // C            -> '[' GroupSet ']'
    // C            -> '[' '^' GroupSet ']'
    // C            -> '{' CharSet '}'

    // GroupSet     -> character '-' character
    // GroupSet     -> character
    // GroupSet     -> character '-' character GroupSet
    // GroupSet     -> character GroupSet

    // CharSet      -> character
    // CharSet      -> CharSet character

    // The terminals are . | * + $ - ^ { } ( ) [ ] character

    std::map<String, unsigned> grammarSymbols =
    {
        // Nonterminals (9 total)
        {"RegExp'",   1u},
        {"RegExp",    2u},
        {"A",         3u},
        {"B",         4u},
        {"C",         5u},
        {"D",         6u},
        {"E",         7u},
        {"CharSet",   8u},
        {"GroupSet",  9u},

        // Terminals (14 total)
        {"character", ('c' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"+",         ('+' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"?",         ('?' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {".",         ('.' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"|",         ('|' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"*",         ('*' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"(",         ('(' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {")",         (')' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"[",         ('[' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"]",         (']' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"{",         ('{' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"}",         ('}' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"-",         ('-' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"^",         ('^' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"$",         ('$' + TokenCode::TokenFirstID) | ProductionMask::Terminal}
    };

    // Productions structure
    static constexpr size_t productionCount = 20u;
    static constexpr struct
    {
        const char* pName;
        const char* pSymbol;
        unsigned    Length;
        const char* pRight[4u];
    }
    init[productionCount] =
    {
        {"RegExpConcat",             "RegExp",   2u, {"RegExp", "A"}                            }, // 0
        {"RegExp",                   "RegExp",   1u, {"A"}                                      }, // 1
        {"AOr",                      "A",        3u, {"A", "|", "B"}                            }, // 2
        {"A",                        "A",        1u, {"B"}                                      }, // 3
        {"BStar",                    "B",        2u, {"B", "*"}                                 }, // 4
        {"BPlus",                    "B",        2u, {"B", "+"}                                 }, // 5
        {"BQuestion",                "B",        2u, {"B", "?"}                                 }, // 6
        {"B",                        "B",        1u, {"C"}                                      }, // 7
        {"CParen",                   "C",        3u, {"(", "RegExp", ")"}                       }, // 8
        {"CChar",                    "C",        1u, {"character"}                              }, // 9
        {"CDot",                     "C",        1u, {"."}                                      }, // 10
        {"CGroupSet",                "C",        3u, {"[", "GroupSet", "]"}                     }, // 11
        {"CNotGroupSet",             "C",        4u, {"[", "^", "GroupSet", "]"}                }, // 12
        {"CCharSet",                 "C",        3u, {"{", "CharSet", "}"}                      }, // 13
        {"GroupSetChar",             "GroupSet", 1u, {"character"}                              }, // 14
        {"GroupSetCharGroupSet",     "GroupSet", 2u, {"character", "GroupSet"}                  }, // 15
        {"GroupSetCharList",         "GroupSet", 3u, {"character", "-", "character"}            }, // 16
        {"GroupSetCharListGroupSet", "GroupSet", 4u, {"character", "-", "character", "GroupSet"}}, // 17
        {"CharSet",                  "CharSet",  1u, {"character"}                              }, // 18
        {"CharSetChar",              "CharSet",  2u, {"CharSet", "character"}                   }  // 19
    };

    std::vector<Production> productions;

    // Create productions
    for (size_t i = 0u; i < productionCount; ++i) {
        unsigned arr[4];
        // Convert names into integers
        for (size_t j = 0u; j < 4u; ++j)
            if (init[i].pRight[j])
                arr[j] = grammarSymbols[init[i].pRight[j]];
        // Add production
        Production p{init[i].pName, grammarSymbols[init[i].pSymbol], arr, init[i].Length};
        productions.push_back(p);
    }

    // And initialize grammar
    grammar.Clear();
    grammar.AddGrammarSymbols(grammarSymbols);
    grammar.AddProductions(productions);
}